

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int mbedtls_ecp_gen_privkey
              (mbedtls_ecp_group *grp,mbedtls_mpi *d,_func_int_void_ptr_uchar_ptr_size_t *f_rng,
              void *p_rng)

{
  mbedtls_ecp_curve_type mVar1;
  int iVar2;
  size_t sVar3;
  bool local_51;
  uint local_50;
  int local_4c;
  uint cmp;
  int count;
  size_t b;
  size_t n_size;
  void *pvStack_30;
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  mbedtls_mpi *d_local;
  mbedtls_ecp_group *grp_local;
  
  n_size._4_4_ = -0x4f80;
  b = grp->nbits + 7 >> 3;
  pvStack_30 = p_rng;
  p_rng_local = f_rng;
  f_rng_local = (_func_int_void_ptr_uchar_ptr_size_t *)d;
  d_local = (mbedtls_mpi *)grp;
  mVar1 = mbedtls_ecp_get_type(grp);
  iVar2 = n_size._4_4_;
  if (mVar1 == MBEDTLS_ECP_TYPE_MONTGOMERY) {
    do {
      n_size._4_4_ = mbedtls_mpi_fill_random
                               ((mbedtls_mpi *)f_rng_local,b,
                                (_func_int_void_ptr_uchar_ptr_size_t *)p_rng_local,pvStack_30);
      if (n_size._4_4_ != 0) {
        return n_size._4_4_;
      }
      sVar3 = mbedtls_mpi_bitlen((mbedtls_mpi *)f_rng_local);
    } while (sVar3 == 0);
    sVar3 = mbedtls_mpi_bitlen((mbedtls_mpi *)f_rng_local);
    _cmp = (mbedtls_mpi_uint *)(sVar3 - 1);
    if (d_local[7].p < _cmp) {
      iVar2 = mbedtls_mpi_shift_r((mbedtls_mpi *)f_rng_local,(long)_cmp - (long)d_local[7].p);
    }
    else {
      iVar2 = mbedtls_mpi_set_bit((mbedtls_mpi *)f_rng_local,(size_t)d_local[7].p,'\x01');
    }
    if (iVar2 != 0) {
      return iVar2;
    }
    n_size._4_4_ = 0;
    n_size._4_4_ = mbedtls_mpi_set_bit((mbedtls_mpi *)f_rng_local,0,'\0');
    if (n_size._4_4_ != 0) {
      return n_size._4_4_;
    }
    n_size._4_4_ = mbedtls_mpi_set_bit((mbedtls_mpi *)f_rng_local,1,'\0');
    if (n_size._4_4_ != 0) {
      return n_size._4_4_;
    }
    iVar2 = 0;
    if ((d_local[7].p == (mbedtls_mpi_uint *)0xfe) &&
       (iVar2 = mbedtls_mpi_set_bit((mbedtls_mpi *)f_rng_local,2,'\0'), iVar2 != 0)) {
      return iVar2;
    }
  }
  n_size._4_4_ = iVar2;
  mVar1 = mbedtls_ecp_get_type((mbedtls_ecp_group *)d_local);
  if (mVar1 == MBEDTLS_ECP_TYPE_SHORT_WEIERSTRASS) {
    local_4c = 0;
    local_50 = 0;
    do {
      n_size._4_4_ = mbedtls_mpi_fill_random
                               ((mbedtls_mpi *)f_rng_local,b,
                                (_func_int_void_ptr_uchar_ptr_size_t *)p_rng_local,pvStack_30);
      if (n_size._4_4_ != 0) {
        return n_size._4_4_;
      }
      n_size._4_4_ = mbedtls_mpi_shift_r((mbedtls_mpi *)f_rng_local,b * 8 - (long)d_local[7].p);
      if (n_size._4_4_ != 0) {
        return n_size._4_4_;
      }
      local_4c = local_4c + 1;
      if (0x1e < local_4c) {
        return -0x4d00;
      }
      n_size._4_4_ = mbedtls_mpi_lt_mpi_ct
                               ((mbedtls_mpi *)f_rng_local,(mbedtls_mpi *)&d_local[6].n,&local_50);
      if (n_size._4_4_ != 0) {
        return n_size._4_4_;
      }
      iVar2 = mbedtls_mpi_cmp_int((mbedtls_mpi *)f_rng_local,1);
      local_51 = iVar2 < 0 || local_50 != 1;
    } while (local_51);
  }
  return n_size._4_4_;
}

Assistant:

int mbedtls_ecp_gen_privkey( const mbedtls_ecp_group *grp,
                     mbedtls_mpi *d,
                     int (*f_rng)(void *, unsigned char *, size_t),
                     void *p_rng )
{
    int ret = MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
    size_t n_size;

    ECP_VALIDATE_RET( grp   != NULL );
    ECP_VALIDATE_RET( d     != NULL );
    ECP_VALIDATE_RET( f_rng != NULL );

    n_size = ( grp->nbits + 7 ) / 8;

#if defined(ECP_MONTGOMERY)
    if( mbedtls_ecp_get_type( grp ) == MBEDTLS_ECP_TYPE_MONTGOMERY )
    {
        /* [M225] page 5 */
        size_t b;

        do {
            MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( d, n_size, f_rng, p_rng ) );
        } while( mbedtls_mpi_bitlen( d ) == 0);

        /* Make sure the most significant bit is nbits */
        b = mbedtls_mpi_bitlen( d ) - 1; /* mbedtls_mpi_bitlen is one-based */
        if( b > grp->nbits )
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( d, b - grp->nbits ) );
        else
            MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( d, grp->nbits, 1 ) );

        /* Make sure the last two bits are unset for Curve448, three bits for
           Curve25519 */
        MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( d, 0, 0 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( d, 1, 0 ) );
        if( grp->nbits == 254 )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( d, 2, 0 ) );
        }
    }
#endif /* ECP_MONTGOMERY */

#if defined(ECP_SHORTWEIERSTRASS)
    if( mbedtls_ecp_get_type( grp ) == MBEDTLS_ECP_TYPE_SHORT_WEIERSTRASS )
    {
        /* SEC1 3.2.1: Generate d such that 1 <= n < N */
        int count = 0;
        unsigned cmp = 0;

        /*
         * Match the procedure given in RFC 6979 (deterministic ECDSA):
         * - use the same byte ordering;
         * - keep the leftmost nbits bits of the generated octet string;
         * - try until result is in the desired range.
         * This also avoids any biais, which is especially important for ECDSA.
         */
        do
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( d, n_size, f_rng, p_rng ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( d, 8 * n_size - grp->nbits ) );

            /*
             * Each try has at worst a probability 1/2 of failing (the msb has
             * a probability 1/2 of being 0, and then the result will be < N),
             * so after 30 tries failure probability is a most 2**(-30).
             *
             * For most curves, 1 try is enough with overwhelming probability,
             * since N starts with a lot of 1s in binary, but some curves
             * such as secp224k1 are actually very close to the worst case.
             */
            if( ++count > 30 )
                return( MBEDTLS_ERR_ECP_RANDOM_FAILED );

            ret = mbedtls_mpi_lt_mpi_ct( d, &grp->N, &cmp );
            if( ret != 0 )
            {
                goto cleanup;
            }
        }
        while( mbedtls_mpi_cmp_int( d, 1 ) < 0 || cmp != 1 );
    }
#endif /* ECP_SHORTWEIERSTRASS */

cleanup:
    return( ret );
}